

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.h
# Opt level: O2

bool __thiscall jbcoin::STPathElement::operator==(STPathElement *this,STPathElement *t)

{
  bool bVar1;
  
  if ((((t->mType ^ this->mType) & 1) == 0) && (this->hash_value_ == t->hash_value_)) {
    bVar1 = jbcoin::operator==(&this->mAccountID,&t->mAccountID);
    if (bVar1) {
      bVar1 = jbcoin::operator==(&this->mCurrencyID,&t->mCurrencyID);
      if (bVar1) {
        bVar1 = jbcoin::operator==(&this->mIssuerID,&t->mIssuerID);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool
    operator== (const STPathElement& t) const
    {
        return (mType & typeAccount) == (t.mType & typeAccount) &&
            hash_value_ == t.hash_value_ &&
            mAccountID == t.mAccountID &&
            mCurrencyID == t.mCurrencyID &&
            mIssuerID == t.mIssuerID;
    }